

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_triangle(rf_vec2 v1,rf_vec2 v2,rf_vec2 v3,rf_color color)

{
  _Bool _Var1;
  undefined1 local_24;
  undefined1 uStack_23;
  undefined1 uStack_22;
  undefined1 uStack_21;
  undefined4 uStack_20;
  rf_color color_local;
  rf_vec2 v3_local;
  rf_vec2 v2_local;
  rf_vec2 v1_local;
  
  _Var1 = rf_gfx_check_buffer_limit(4);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  local_24 = color.r;
  uStack_23 = color.g;
  uStack_22 = color.b;
  uStack_21 = color.a;
  rf_gfx_color4ub(local_24,uStack_23,uStack_22,uStack_21);
  v2_local.x = v1.x;
  v2_local.y = v1.y;
  rf_gfx_vertex2f(v2_local.x,v2_local.y);
  v3_local.x = v2.x;
  v3_local.y = v2.y;
  rf_gfx_vertex2f(v3_local.x,v3_local.y);
  uStack_20 = v3.x;
  color_local = (rf_color)v3.y;
  rf_gfx_vertex2f(uStack_20,(float)color_local);
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_triangle(rf_vec2 v1, rf_vec2 v2, rf_vec2 v3, rf_color color)
{
    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();
    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(v1.x, v1.y);
    rf_gfx_vertex2f(v2.x, v2.y);
    rf_gfx_vertex2f(v3.x, v3.y);
    rf_gfx_end();

}